

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

sysbvm_context_t * sysbvm_context_loadImageFromFileNamed(char *filename)

{
  return (sysbvm_context_t *)0x0;
}

Assistant:

SYSBVM_API sysbvm_context_t *sysbvm_context_loadImageFromFileNamed(const char *filename)
{
#if 0
#ifdef _WIN32
    FILE *inputFile = NULL;
    if(fopen_s(&inputFile, filename, "rb"))
        return NULL;
#else
    FILE *inputFile = fopen(filename, "rb");
#endif
    if(!inputFile)
        return NULL;

    char magic[4] = {0};
    if(fread(magic, 4, 1, inputFile) != 1 || memcmp(magic, "TVIM", 4))
    {
        fclose(inputFile);
        return NULL;
    }

    sysbvm_context_t *context = (sysbvm_context_t*)calloc(1, sizeof(sysbvm_context_t));
    if(fread(&context->targetWordSize, sizeof(context->targetWordSize), 1, inputFile) != 1 ||
        fread(&context->identityHashSeed, sizeof(context->identityHashSeed), 1, inputFile) != 1 ||
        fread(&context->roots, sizeof(context->roots), 1, inputFile) != 1 ||
        !sysbvm_heap_loadFromFile(&context->heap, inputFile, sizeof(context->roots) / sizeof(sysbvm_tuple_t), (sysbvm_tuple_t*)&context->roots))
    {
        fclose(inputFile);
        free(context);
        return NULL;
    }
    
    context->jitEnabled = sysbvm_context_default_jitEnabled;

    fclose(inputFile);

    context->roots.sessionToken = sysbvm_tuple_systemHandle_encode(context, sysbvm_tuple_systemHandle_decode(context->roots.sessionToken) +  1);
    return context;
#else
    (void)filename;
    return NULL;
#endif
}